

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

cmExternalMakefileProjectGeneratorFactory * cmExtraSublimeTextGenerator::GetFactory(void)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  string local_28;
  
  if ((GetFactory()::factory == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetFactory()::factory), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"Sublime Text 2",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Generates Sublime Text 2 project files (deprecated).",&local_61)
    ;
    cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator>::
    cmExternalMakefileProjectGeneratorSimpleFactory(&GetFactory::factory,&local_28,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::~string((string *)&local_28);
    std::allocator<char>::~allocator(&local_29);
    __cxa_atexit(cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator>::
                 ~cmExternalMakefileProjectGeneratorSimpleFactory,&GetFactory::factory,&__dso_handle
                );
    __cxa_guard_release(&GetFactory()::factory);
  }
  cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
            (&local_80,&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Ninja",&local_a1);
    cmExternalMakefileProjectGeneratorFactory::AddSupportedGlobalGenerator
              (&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Unix Makefiles",&local_c9);
    cmExternalMakefileProjectGeneratorFactory::AddSupportedGlobalGenerator
              (&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  return &GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory;
}

Assistant:

cmExternalMakefileProjectGeneratorFactory*
cmExtraSublimeTextGenerator::GetFactory()
{
  static cmExternalMakefileProjectGeneratorSimpleFactory<
    cmExtraSublimeTextGenerator>
    factory("Sublime Text 2",
            "Generates Sublime Text 2 project files (deprecated).");

  if (factory.GetSupportedGlobalGenerators().empty()) {
#if defined(_WIN32)
    factory.AddSupportedGlobalGenerator("MinGW Makefiles");
    factory.AddSupportedGlobalGenerator("NMake Makefiles");
// disable until somebody actually tests it:
// factory.AddSupportedGlobalGenerator("MSYS Makefiles");
#endif
    factory.AddSupportedGlobalGenerator("Ninja");
    factory.AddSupportedGlobalGenerator("Unix Makefiles");
  }

  return &factory;
}